

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turnning.c
# Opt level: O2

double fuseOrientations(double *orientations,double *weights,int size)

{
  int iVar1;
  double *list;
  long lVar2;
  int size_00;
  size_t __size;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  
  list = (double *)malloc(8);
  if (size < 1) {
    size = 0;
  }
  size_00 = 0;
  for (uVar3 = 0; uVar3 != (uint)size; uVar3 = uVar3 + 1) {
    dVar5 = round(weights[uVar3] * 1000.0);
    iVar1 = (int)dVar5;
    lVar2 = (long)size_00;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    size_00 = size_00 + iVar1;
    __size = lVar2 * 8 + 0x10;
    lVar2 = size_00 - lVar2;
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
      *(double *)((long)list + (__size - 0x10)) = orientations[uVar3];
      list = (double *)realloc(list,__size);
      __size = __size + 8;
    }
  }
  dVar5 = calculateAngle325(list,size_00);
  return dVar5;
}

Assistant:

double fuseOrientations(double orientations[], double weights[],int size){
    int count = 0;
    double* list = (double*)malloc(sizeof(double));
    for (int i = 0; i < size; i++) {
        int num = round(weights[i] * 1000);
        for(int j = 0;j < num;j++){
            list[count++] = orientations[i];
            list = realloc(list, sizeof(double) * (count + 1));
        }
    }
    return calculateAngle325(list,count);
}